

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::ForStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQFuncState *pSVar2;
  SQUnsignedInteger SVar3;
  SQInstruction *pSVar4;
  ulong uVar5;
  ulong uVar6;
  SQInteger SVar7;
  longlong *plVar8;
  SQUnsignedInteger SVar9;
  ulong uVar10;
  SQUnsignedInteger SVar11;
  long lVar12;
  long lVar13;
  SQUnsignedInteger SVar14;
  SQInstructionVec exp;
  SQScope __oldscope__;
  sqvector<SQInstruction> local_88;
  SQUnsignedInteger local_70;
  ulong local_68;
  SQUnsignedInteger local_60;
  long local_58;
  SQInstruction local_50;
  SQInteger local_48;
  SQInteger SStack_40;
  
  SVar7 = SQLexer::Lex(&this->_lex);
  this->_token = SVar7;
  local_48 = (this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar2 = this->_fs;
  (this->_scope).outers = pSVar2->_outers;
  SVar7 = SQFuncState::GetStackSize(pSVar2);
  (this->_scope).stacksize = SVar7;
  Expect(this,0x28);
  if (this->_token != 0x3b) {
    if (this->_token == 0x11b) {
      LocalDeclStatement(this);
    }
    else {
      CommaExpr(this);
      SQFuncState::PopTarget(this->_fs);
    }
  }
  Expect(this,0x3b);
  pSVar2 = this->_fs;
  pSVar2->_optimization = false;
  SVar9 = (pSVar2->_instructions)._size;
  uVar10 = 0xffffffffffffffff;
  if (this->_token != 0x3b) {
    CommaExpr(this);
    pSVar2 = this->_fs;
    SVar7 = SQFuncState::PopTarget(pSVar2);
    local_88._vals._0_6_ = CONCAT15((char)SVar7,0x1e00000000);
    local_88._vals = (SQInstruction *)((ulong)(ushort)((uint6)local_88._vals._0_6_ >> 0x20) << 0x20)
    ;
    SQFuncState::AddInstruction(pSVar2,(SQInstruction *)&local_88);
    uVar10 = (this->_fs->_instructions)._size - 1;
  }
  Expect(this,0x3b);
  pSVar2 = this->_fs;
  pSVar2->_optimization = false;
  SVar11 = (pSVar2->_instructions)._size;
  if (this->_token != 0x29) {
    CommaExpr(this);
    SQFuncState::PopTarget(this->_fs);
  }
  Expect(this,0x29);
  SVar3 = (this->_fs->_instructions)._size;
  lVar13 = SVar11 - SVar3;
  local_58 = SVar11 - SVar3;
  this->_fs->_optimization = false;
  local_88._vals = (SQInstruction *)0x0;
  local_88._size = 0;
  local_88._allocated = 0;
  local_70 = SVar9;
  local_68 = uVar10;
  local_60 = SVar11;
  if (local_58 < 0) {
    do {
      pSVar4 = (this->_fs->_instructions)._vals;
      if (local_88._allocated <= local_88._size) {
        uVar10 = local_88._size * 2;
        if (uVar10 == 0) {
          uVar10 = 4;
        }
        local_88._vals =
             (SQInstruction *)sq_vm_realloc(local_88._vals,local_88._allocated << 3,uVar10 * 8);
        local_88._allocated = uVar10;
      }
      uVar10 = local_88._size + 1;
      local_88._vals[local_88._size] = pSVar4[SVar11];
      SVar11 = SVar11 + 1;
      local_88._size = uVar10;
    } while (SVar3 != SVar11);
    SVar9 = local_70;
    uVar10 = local_68;
    if (lVar13 < 0) {
      pSVar1 = &(this->_fs->_instructions)._size;
      *pSVar1 = *pSVar1 + lVar13;
    }
  }
  pSVar2 = this->_fs;
  local_70 = (pSVar2->_unresolvedbreaks)._size;
  local_68 = (pSVar2->_unresolvedcontinues)._size;
  uVar5 = (pSVar2->_breaktargets)._allocated;
  uVar6 = (pSVar2->_breaktargets)._size;
  if (uVar5 <= uVar6) {
    SVar11 = uVar6 * 2;
    SVar14 = 4;
    if (SVar11 != 0) {
      SVar14 = SVar11;
    }
    plVar8 = (longlong *)sq_vm_realloc((pSVar2->_breaktargets)._vals,uVar5 << 3,SVar14 * 8);
    (pSVar2->_breaktargets)._vals = plVar8;
    (pSVar2->_breaktargets)._allocated = SVar14;
  }
  SVar11 = (pSVar2->_breaktargets)._size;
  (pSVar2->_breaktargets)._size = SVar11 + 1;
  (pSVar2->_breaktargets)._vals[SVar11] = 0;
  pSVar2 = this->_fs;
  uVar5 = (pSVar2->_continuetargets)._size;
  uVar6 = (pSVar2->_continuetargets)._allocated;
  if (uVar6 <= uVar5) {
    SVar11 = uVar5 * 2;
    SVar14 = 4;
    if (SVar11 != 0) {
      SVar14 = SVar11;
    }
    plVar8 = (longlong *)sq_vm_realloc((pSVar2->_continuetargets)._vals,uVar6 << 3,SVar14 * 8);
    (pSVar2->_continuetargets)._vals = plVar8;
    (pSVar2->_continuetargets)._allocated = SVar14;
  }
  SVar11 = (pSVar2->_continuetargets)._size;
  (pSVar2->_continuetargets)._size = SVar11 + 1;
  (pSVar2->_continuetargets)._vals[SVar11] = 0;
  Statement(this,true);
  SVar11 = (this->_fs->_instructions)._size;
  if (local_58 < 0) {
    lVar13 = SVar3 - local_60;
    lVar12 = 0;
    do {
      SQFuncState::AddInstruction
                (this->_fs,(SQInstruction *)((long)&(local_88._vals)->_arg1 + lVar12));
      lVar12 = lVar12 + 8;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  local_50._arg1 = (int)SVar9 + ~(uint)(this->_fs->_instructions)._size;
  local_50.op = '\x1c';
  local_50._arg0 = '\0';
  local_50._arg2 = '\0';
  local_50._arg3 = '\0';
  SQFuncState::AddInstruction(this->_fs,&local_50);
  if (0 < (long)uVar10) {
    SQFuncState::SetIntructionParam(this->_fs,uVar10,1,~uVar10 + (this->_fs->_instructions)._size);
  }
  lVar13 = this->_fs->_outers;
  SVar7 = SQFuncState::GetStackSize(this->_fs);
  lVar12 = (this->_scope).stacksize;
  if (SVar7 != lVar12) {
    SQFuncState::SetStackSize(this->_fs,lVar12);
    if (lVar13 != this->_fs->_outers) {
      local_50._arg1 = (SQInt32)(this->_scope).stacksize;
      local_50.op = '<';
      local_50._arg0 = '\0';
      local_50._arg2 = '\0';
      local_50._arg3 = '\0';
      SQFuncState::AddInstruction(this->_fs,&local_50);
    }
  }
  (this->_scope).outers = local_48;
  (this->_scope).stacksize = SStack_40;
  pSVar2 = this->_fs;
  SVar9 = (pSVar2->_unresolvedbreaks)._size;
  lVar13 = (pSVar2->_unresolvedcontinues)._size - local_68;
  if (0 < lVar13) {
    ResolveContinues(this,pSVar2,lVar13,SVar11 - 1);
  }
  lVar13 = SVar9 - local_70;
  if (0 < lVar13) {
    ResolveBreaks(this,this->_fs,lVar13);
  }
  pSVar2 = this->_fs;
  pSVar1 = &(pSVar2->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar2->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  sqvector<SQInstruction>::~sqvector(&local_88);
  return;
}

Assistant:

void ForStatement()
    {
        Lex();
        BEGIN_SCOPE();
        Expect(_SC('('));
        if(_token == TK_LOCAL) LocalDeclStatement();
        else if(_token != _SC(';')){
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger jmppos = _fs->GetCurrentPos();
        SQInteger jzpos = -1;
        if(_token != _SC(';')) { CommaExpr(); _fs->AddInstruction(_OP_JZ, _fs->PopTarget()); jzpos = _fs->GetCurrentPos(); }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger expstart = _fs->GetCurrentPos() + 1;
        if(_token != _SC(')')) {
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(')'));
        _fs->SnoozeOpt();
        SQInteger expend = _fs->GetCurrentPos();
        SQInteger expsize = (expend - expstart) + 1;
        SQInstructionVec exp;
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                exp.push_back(_fs->GetInstruction(expstart + i));
            _fs->PopInstructions(expsize);
        }
        BEGIN_BREAKBLE_BLOCK()
        Statement();
        SQInteger continuetrg = _fs->GetCurrentPos();
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                _fs->AddInstruction(exp[i]);
        }
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1, 0);
        if(jzpos>  0) _fs->SetIntructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);
        END_SCOPE();

        END_BREAKBLE_BLOCK(continuetrg);
    }